

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cc
# Opt level: O0

void __thiscall Text::Text(Text *this,u16string *content)

{
  initializer_list<unsigned_int> __l;
  size_type sVar1;
  reference pvVar2;
  value_type_conflict2 local_48;
  uint local_44;
  uint local_40;
  uint32_t size;
  uint32_t offset;
  allocator<unsigned_int> local_2d;
  uint local_2c;
  iterator local_28;
  size_type local_20;
  u16string *local_18;
  u16string *content_local;
  Text *this_local;
  
  local_18 = content;
  content_local = &this->content;
  std::__cxx11::u16string::u16string((u16string *)this,content);
  local_2c = 0;
  local_28 = &local_2c;
  local_20 = 1;
  std::allocator<unsigned_int>::allocator(&local_2d);
  __l._M_len = local_20;
  __l._M_array = local_28;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->line_offsets,__l,&local_2d);
  std::allocator<unsigned_int>::~allocator(&local_2d);
  local_40 = 0;
  sVar1 = std::__cxx11::
          basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::size
                    (&this->content);
  local_44 = (uint)sVar1;
  for (; local_40 < local_44; local_40 = local_40 + 1) {
    pvVar2 = std::__cxx11::
             basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
             operator[](&this->content,(ulong)local_40);
    if (*pvVar2 == L'\n') {
      local_48 = local_40 + 1;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&this->line_offsets,&local_48);
    }
  }
  return;
}

Assistant:

Text::Text(u16string &&content) : content{move(content)}, line_offsets{0} {
  for (uint32_t offset = 0, size = this->content.size(); offset < size; offset++) {
    if (this->content[offset] == '\n') {
      line_offsets.push_back(offset + 1);
    }
  }
}